

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_MappingTag::Hash(ON_SHA1_Hash *__return_storage_ptr__,ON_MappingTag *this)

{
  ON_Xform *this_00;
  TYPE TVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uchar u;
  ON_SHA1 sha1;
  
  TVar1 = this->m_mapping_type;
  if (TVar1 - plane_mapping < 8) {
    bVar3 = IsSet(this);
    if (bVar3) {
      this_00 = &this->m_mesh_xform;
      bVar4 = ON_Xform::IsIdentity(this_00,2.3283064365386963e-10);
      bVar3 = true;
      if ((bVar4) || (bVar4 = ON_Xform::IsZero(this_00), bVar4)) {
        bVar4 = false;
      }
      else {
        bVar4 = ON_Xform::IsValid(this_00);
      }
      bVar2 = true;
      goto LAB_00525d90;
    }
LAB_00525d53:
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (TVar1 != srfp_mapping) {
      if (TVar1 == no_mapping) goto LAB_00525d53;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0x3483,"","Invalid m_mapping_type value.");
    }
  }
  bVar2 = false;
  bVar4 = false;
LAB_00525d90:
  ON_SHA1::ON_SHA1(&sha1);
  if (bVar3) {
    u = (uchar)this->m_mapping_type;
    ON_SHA1::AccumulateBytes(&sha1,&u,1);
  }
  if (bVar2) {
    ON_SHA1::AccumulateId(&sha1,&this->m_mapping_id);
    ON_SHA1::AccumulateInteger32(&sha1,this->m_mapping_crc);
  }
  if (bVar4 != false) {
    ON_SHA1::AccumulateTransformation(&sha1,&this->m_mesh_xform);
  }
  ON_SHA1::Hash(__return_storage_ptr__,&sha1);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_MappingTag::Hash() const
{
  bool bHashType = true;
  bool bHashIdAndCRC = false;
  bool bHashXform = false;
  switch (m_mapping_type)
  {
  case ON_TextureMapping::TYPE::no_mapping:
    bHashType = false;
    break;
  case ON_TextureMapping::TYPE::srfp_mapping:
    break;
  case ON_TextureMapping::TYPE::plane_mapping:
  case ON_TextureMapping::TYPE::cylinder_mapping:
  case ON_TextureMapping::TYPE::sphere_mapping:
  case ON_TextureMapping::TYPE::box_mapping:
  case ON_TextureMapping::TYPE::mesh_mapping_primitive:
  case ON_TextureMapping::TYPE::srf_mapping_primitive:
  case ON_TextureMapping::TYPE::brep_mapping_primitive:
  case ON_TextureMapping::TYPE::ocs_mapping:
    if (IsSet())
    {
      bHashIdAndCRC = true;
      if (false == m_mesh_xform.IsIdentity(ON_ZERO_TOLERANCE) && false == m_mesh_xform.IsZero() && m_mesh_xform.IsValid())
        bHashXform = true;
    }
    else
      bHashType = false; // bogus mapping - treat as unset 
    break;
  default:
    // Perhaps somebody added a value to the enum after June 2020 and failed to update this code?
    ON_ERROR("Invalid m_mapping_type value.");
    break;
  }

  ON_SHA1 sha1;
  if (bHashType)
  {
    const unsigned char u = (unsigned char)m_mapping_type;
    sha1.AccumulateBytes(&u,1);
  }
  if (bHashIdAndCRC)
  {
    sha1.AccumulateId(m_mapping_id);
    sha1.AccumulateInteger32(m_mapping_crc);
  }
  if (bHashXform)
  {
    sha1.AccumulateTransformation(m_mesh_xform);
  }
  return sha1.Hash();
}